

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O2

void UpdateJoystickMenu(IJoystickConfig *selected)

{
  TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this;
  FOptionMenuDescriptor *this_00;
  uint uVar1;
  bool bVar2;
  FMenuDescriptor **ppFVar3;
  FOptionMenuItemOption *this_01;
  FOptionMenuItem *pFVar4;
  FOptionMenuItemJoyConfigMenu *this_02;
  uint uVar5;
  uint i;
  ulong uVar6;
  FOptionMenuItem *it;
  FString local_40;
  FName local_34;
  
  local_34.Index = 0x21a;
  ppFVar3 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            CheckKey(&MenuDescriptors,&local_34);
  if ((ppFVar3 != (FMenuDescriptor **)0x0) &&
     (this_00 = (FOptionMenuDescriptor *)*ppFVar3, (this_00->super_FMenuDescriptor).mType == 1)) {
    this = &this_00->mItems;
    for (uVar6 = 0;
        uVar6 < (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
        uVar6 = uVar6 + 1) {
      pFVar4 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar6];
      if (pFVar4 != (FOptionMenuItem *)0x0) {
        (*(pFVar4->super_FListMenuItem)._vptr_FListMenuItem[1])();
      }
    }
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Clear
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
    I_GetJoysticks(&Joysticks);
    uVar5 = Joysticks.Count - 1;
    if (selected != (IJoystickConfig *)0x0) {
      for (uVar6 = 0; Joysticks.Count != uVar6; uVar6 = uVar6 + 1) {
        if (Joysticks.Array[uVar6] == selected) {
          uVar5 = (uint)uVar6;
          break;
        }
      }
    }
    this_01 = (FOptionMenuItemOption *)operator_new(0x40);
    FOptionMenuItemOption::FOptionMenuItemOption
              (this_01,"Enable controller support","use_joystick","YesNo",(char *)0x0,0);
    it = (FOptionMenuItem *)this_01;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
    pFVar4 = (FOptionMenuItem *)operator_new(0x28);
    FOptionMenuItemStaticText::FOptionMenuItemStaticText
              ((FOptionMenuItemStaticText *)pFVar4," ",false);
    it = pFVar4;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
    uVar1 = Joysticks.Count;
    pFVar4 = (FOptionMenuItem *)operator_new(0x28);
    if (uVar1 == 0) {
      FOptionMenuItemStaticText::FOptionMenuItemStaticText
                ((FOptionMenuItemStaticText *)pFVar4,"No controllers detected",false);
      it = pFVar4;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
      if (use_joystick.Value == false) {
        pFVar4 = (FOptionMenuItem *)operator_new(0x28);
        FOptionMenuItemStaticText::FOptionMenuItemStaticText
                  ((FOptionMenuItemStaticText *)pFVar4,"Controller support must be",false);
        it = pFVar4;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
        pFVar4 = (FOptionMenuItem *)operator_new(0x28);
        FOptionMenuItemStaticText::FOptionMenuItemStaticText
                  ((FOptionMenuItemStaticText *)pFVar4,"enabled to detect any",false);
        it = pFVar4;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
      }
    }
    else {
      FOptionMenuItemStaticText::FOptionMenuItemStaticText
                ((FOptionMenuItemStaticText *)pFVar4,"Configure controllers:",false);
      it = pFVar4;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
      for (uVar6 = 0; (long)uVar6 < (long)(int)Joysticks.Count; uVar6 = uVar6 + 1) {
        this_02 = (FOptionMenuItemJoyConfigMenu *)operator_new(0x30);
        (*Joysticks.Array[uVar6]->_vptr_IJoystickConfig[2])(&local_40);
        FOptionMenuItemJoyConfigMenu::FOptionMenuItemJoyConfigMenu
                  (this_02,local_40.Chars,Joysticks.Array[uVar6]);
        it = (FOptionMenuItem *)this_02;
        FString::~FString(&local_40);
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
        if (uVar5 == uVar6) {
          this_00->mSelectedItem =
               (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
        }
      }
    }
    uVar5 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    if ((int)uVar5 <= this_00->mSelectedItem) {
      this_00->mSelectedItem = uVar5 - 1;
    }
    FOptionMenuDescriptor::CalcIndent(this_00);
    for (uVar6 = 0; Joysticks.Count != uVar6; uVar6 = uVar6 + 1) {
      if (Joysticks.Array[uVar6] == SELECTED_JOYSTICK) {
        if (Joysticks.Count != (uint)uVar6) {
          return;
        }
        break;
      }
    }
    SELECTED_JOYSTICK = (IJoystickConfig *)0x0;
    if ((DMenu::CurrentMenu != (DMenu *)0x0) &&
       (bVar2 = DObject::IsKindOf(&DMenu::CurrentMenu->super_DObject,
                                  DJoystickConfigMenu::RegistrationInfo.MyClass), bVar2)) {
      (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xd])();
    }
  }
  return;
}

Assistant:

void UpdateJoystickMenu(IJoystickConfig *selected)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_JoystickOptions);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		FOptionMenuDescriptor *opt = (FOptionMenuDescriptor *)*desc;
		FOptionMenuItem *it;
		for(unsigned i=0;i<opt->mItems.Size();i++)
		{
			delete opt->mItems[i];
		}
		opt->mItems.Clear();

		int i;
		int itemnum = -1;

		I_GetJoysticks(Joysticks);
		if ((unsigned)itemnum >= Joysticks.Size())
		{
			itemnum = Joysticks.Size() - 1;
		}
		if (selected != NULL)
		{
			for (i = 0; (unsigned)i < Joysticks.Size(); ++i)
			{
				if (Joysticks[i] == selected)
				{
					itemnum = i;
					break;
				}
			}
		}

		// Todo: Block joystick for changing this one.
		it = new FOptionMenuItemOption("Enable controller support", "use_joystick", "YesNo", NULL, false);
		opt->mItems.Push(it);
		#ifdef _WIN32
			it = new FOptionMenuItemOption("Enable DirectInput controllers", "joy_dinput", "YesNo", NULL, false);
			opt->mItems.Push(it);
			it = new FOptionMenuItemOption("Enable XInput controllers", "joy_xinput", "YesNo", NULL, false);
			opt->mItems.Push(it);
			it = new FOptionMenuItemOption("Enable raw PlayStation 2 adapters", "joy_ps2raw", "YesNo", NULL, false);
			opt->mItems.Push(it);
		#endif

		it = new FOptionMenuItemStaticText(" ", false);
		opt->mItems.Push(it);

		if (Joysticks.Size() == 0)
		{
			it = new FOptionMenuItemStaticText("No controllers detected", false);
			opt->mItems.Push(it);
			if (!use_joystick)
			{
				it = new FOptionMenuItemStaticText("Controller support must be", false);
				opt->mItems.Push(it);
				it = new FOptionMenuItemStaticText("enabled to detect any", false);
				opt->mItems.Push(it);
			}
		}
		else
		{
			it = new FOptionMenuItemStaticText("Configure controllers:", false);
			opt->mItems.Push(it);

			for (int i = 0; i < (int)Joysticks.Size(); ++i)
			{
				it = new FOptionMenuItemJoyConfigMenu(Joysticks[i]->GetName(), Joysticks[i]);
				opt->mItems.Push(it);
				if (i == itemnum) opt->mSelectedItem = opt->mItems.Size();
			}
		}
		if (opt->mSelectedItem >= (int)opt->mItems.Size())
		{
			opt->mSelectedItem = opt->mItems.Size() - 1;
		}

		opt->CalcIndent();

		// If the joystick config menu is open, close it if the device it's
		// open for is gone.
		for (i = 0; (unsigned)i < Joysticks.Size(); ++i)
		{
			if (Joysticks[i] == SELECTED_JOYSTICK)
			{
				break;
			}
		}
		if (i == (int)Joysticks.Size())
		{
			SELECTED_JOYSTICK = NULL;
			if (DMenu::CurrentMenu != NULL && DMenu::CurrentMenu->IsKindOf(RUNTIME_CLASS(DJoystickConfigMenu)))
			{
				DMenu::CurrentMenu->Close();
			}
		}
	}
}